

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UpdateBlock(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *Node)

{
  bool bVar1;
  int iVar2;
  iterator it;
  Block B;
  string local_20c0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20a0;
  Block local_2040;
  
  Block::Block(&local_2040,blocks.buffer + (Node->self).BlockNum);
  if ((Node->self).FileOff == local_2040.FileOff) {
    bVar1 = std::operator!=(&this->Index_FileName,&local_2040.FileName);
    if (!bVar1) goto LAB_0012f4db;
  }
  std::__cxx11::string::string((string *)&local_20c0,(string *)&this->Index_FileName);
  iVar2 = Buffer::Allocate(&blocks,&local_20c0,(Node->self).FileOff);
  (Node->self).BlockNum = iVar2;
  std::__cxx11::string::~string((string *)&local_20c0);
LAB_0012f4db:
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_20a0,Node);
  Node2Block(this,&local_20a0);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_20a0);
  it = Buffer::Find(&blocks,(Node->self).BlockNum);
  Buffer::Update(&blocks,it);
  std::__cxx11::string::~string((string *)&local_2040);
  return;
}

Assistant:

void BpTree<K>::UpdateBlock(IndexNode<K> Node) {
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	this->Node2Block(Node);
	blocks.Update(blocks.Find(Node.self.BlockNum));
}